

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t * Aig_ManMiterPartitioned(Aig_Man_t *p1,Aig_Man_t *p2,int nPartSize,int fSmart)

{
  Vec_Ptr_t *vParts;
  Vec_Int_t *vPart;
  Vec_Int_t *vSuppMap;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vNodes1;
  Vec_Ptr_t *vNodes2;
  Aig_Obj_t *pDriver;
  int i;
  int iVar1;
  Vec_Ptr_t *vPartSupps;
  Vec_Ptr_t *local_50;
  Vec_Ptr_t *local_48;
  Aig_Man_t *local_40;
  Aig_Man_t *local_38;
  
  local_40 = p1;
  local_38 = p2;
  if (fSmart == 0) {
    vParts = Aig_ManPartitionNaive(p1,nPartSize);
    local_50 = Aig_ManSupportNodes(p1,vParts);
  }
  else {
    vParts = Aig_ManPartitionSmart(p1,nPartSize,0,&local_50);
  }
  local_48 = Vec_PtrAlloc(vParts->nSize);
  for (i = 0; i < vParts->nSize; i = i + 1) {
    vPart = (Vec_Int_t *)Vec_PtrEntry(vParts,i);
    vSuppMap = (Vec_Int_t *)Vec_PtrEntry(local_50,i);
    pNew = Aig_ManStart(1000);
    for (iVar1 = 0; iVar1 < vSuppMap->nSize; iVar1 = iVar1 + 1) {
      Aig_ObjCreateCi(pNew);
    }
    vNodes1 = Aig_ManDupPart(pNew,local_40,vPart,vSuppMap,0);
    vNodes2 = Aig_ManDupPart(pNew,local_38,vPart,vSuppMap,0);
    pDriver = Aig_MiterTwo(pNew,vNodes1,vNodes2);
    Vec_PtrFree(vNodes1);
    Vec_PtrFree(vNodes2);
    Aig_ObjCreateCo(pNew,pDriver);
    Aig_ManCleanup(pNew);
    Vec_PtrPush(local_48,pNew);
  }
  Vec_VecFree((Vec_Vec_t *)vParts);
  Vec_VecFree((Vec_Vec_t *)local_50);
  return local_48;
}

Assistant:

Vec_Ptr_t * Aig_ManMiterPartitioned( Aig_Man_t * p1, Aig_Man_t * p2, int nPartSize, int fSmart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pMiter;
    Vec_Ptr_t * vMiters, * vNodes1, * vNodes2;
    Vec_Ptr_t * vParts, * vPartSupps;
    Vec_Int_t * vPart, * vPartSupp;
    int i, k;
    // partition the first manager
    if ( fSmart )
        vParts = Aig_ManPartitionSmart( p1, nPartSize, 0, &vPartSupps );
    else
    {
        vParts = Aig_ManPartitionNaive( p1, nPartSize );
        vPartSupps = Aig_ManSupportNodes( p1, vParts );
    }
    // derive miters
    vMiters = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    for ( i = 0; i < Vec_PtrSize(vParts); i++ )
    {
        // get partition and its support
        vPart     = (Vec_Int_t *)Vec_PtrEntry( vParts, i );
        vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSupps, i );
        // create the new miter
        pNew = Aig_ManStart( 1000 );
        // create the PIs
        for ( k = 0; k < Vec_IntSize(vPartSupp); k++ )
            Aig_ObjCreateCi( pNew );
        // copy the components
        vNodes1 = Aig_ManDupPart( pNew, p1, vPart, vPartSupp, 0 );
        vNodes2 = Aig_ManDupPart( pNew, p2, vPart, vPartSupp, 0 );
        // create the miter
        pMiter = Aig_MiterTwo( pNew, vNodes1, vNodes2 );
        Vec_PtrFree( vNodes1 );
        Vec_PtrFree( vNodes2 );
        // create the output
        Aig_ObjCreateCo( pNew, pMiter );
        // clean up
        Aig_ManCleanup( pNew );
        Vec_PtrPush( vMiters, pNew );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_VecFree( (Vec_Vec_t *)vPartSupps );
    return vMiters;
}